

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtxml.cpp
# Opt level: O1

void printNoteElements(UString *src,UErrorCode *status)

{
  int destCapacity;
  int32_t iVar1;
  int32_t srcLen;
  int index;
  UChar *note;
  UChar *local_38;
  
  local_38 = (UChar *)0x0;
  if (src != (UString *)0x0) {
    destCapacity = src->fLength;
    local_38 = (UChar *)uprv_malloc_63((long)destCapacity * 2);
    iVar1 = getCount(src->fChars,src->fLength,UPC_NOTE,status);
    if (0 < iVar1 && *status < U_ILLEGAL_ARGUMENT_ERROR) {
      index = 0;
      do {
        srcLen = getAt(src->fChars,src->fLength,&local_38,destCapacity,index,UPC_NOTE,status);
        if (U_ZERO_ERROR < *status) break;
        if (0 < srcLen) {
          write_tabs(out);
          print(local_38,srcLen,"<note>","</note>",status);
        }
        index = index + 1;
      } while (iVar1 != index);
    }
    uprv_free_63(local_38);
  }
  return;
}

Assistant:

static void
printNoteElements(const UString *src, UErrorCode *status){

#if UCONFIG_NO_REGULAR_EXPRESSIONS==0 /* donot compile when no RegularExpressions are available */

    int32_t capacity = 0;
    UChar* note = NULL;
    int32_t noteLen = 0;
    int32_t count = 0,i;

    if(src == NULL){
        return;
    }

    capacity = src->fLength;
    note  = (UChar*) uprv_malloc(U_SIZEOF_UCHAR * capacity);

    count = getCount(src->fChars,src->fLength, UPC_NOTE, status);
    if(U_FAILURE(*status)){
        uprv_free(note);
        return;
    }
    for(i=0; i < count; i++){
        noteLen =  getAt(src->fChars,src->fLength, &note, capacity, i, UPC_NOTE, status);
        if(U_FAILURE(*status)){
            uprv_free(note);
            return;
        }
        if(noteLen > 0){
            write_tabs(out);
            print(note, noteLen,"<note>", "</note>", status);
        }
    }
    uprv_free(note);
#else

    fprintf(stderr, "Warning: Could not output comments to XLIFF file. ICU has been built without RegularExpression support.\n");

#endif /* UCONFIG_NO_REGULAR_EXPRESSIONS */

}